

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall
QScrollBarPrivate::activateControl(QScrollBarPrivate *this,uint control,int threshold)

{
  ulong uVar1;
  undefined4 in_EDX;
  int in_ESI;
  QScrollBarPrivate *in_RDI;
  QAbstractSlider *unaff_retaddr;
  SliderAction action;
  int in_stack_ffffffffffffffe8;
  SliderAction action_00;
  QScrollBarPrivate *pQVar2;
  SliderAction action_01;
  
  action_00 = SliderNoAction;
  uVar1 = (ulong)(in_ESI - 1);
  switch(uVar1) {
  case 0:
    action_00 = SliderSingleStepAdd;
    break;
  case 1:
    action_00 = SliderSingleStepSub;
    break;
  default:
    break;
  case 3:
    action_00 = SliderPageStepAdd;
    break;
  case 7:
    action_00 = SliderPageStepSub;
    break;
  case 0xf:
    action_00 = SliderToMinimum;
    break;
  case 0x1f:
    action_00 = SliderToMaximum;
  }
  if (action_00 != SliderNoAction) {
    pQVar2 = in_RDI;
    q_func(in_RDI);
    action_01 = (SliderAction)((ulong)pQVar2 >> 0x20);
    QAbstractSlider::setRepeatAction
              ((QAbstractSlider *)CONCAT44(in_ESI,in_EDX),action_00,in_stack_ffffffffffffffe8,
               (int)(uVar1 >> 0x20));
    q_func(in_RDI);
    QAbstractSlider::triggerAction(unaff_retaddr,action_01);
  }
  return;
}

Assistant:

void QScrollBarPrivate::activateControl(uint control, int threshold)
{
    QAbstractSlider::SliderAction action = QAbstractSlider::SliderNoAction;
    switch (control) {
    case QStyle::SC_ScrollBarAddPage:
        action = QAbstractSlider::SliderPageStepAdd;
        break;
    case QStyle::SC_ScrollBarSubPage:
        action = QAbstractSlider::SliderPageStepSub;
        break;
    case QStyle::SC_ScrollBarAddLine:
        action = QAbstractSlider::SliderSingleStepAdd;
        break;
    case QStyle::SC_ScrollBarSubLine:
        action = QAbstractSlider::SliderSingleStepSub;
        break;
    case QStyle::SC_ScrollBarFirst:
        action = QAbstractSlider::SliderToMinimum;
        break;
    case QStyle::SC_ScrollBarLast:
        action = QAbstractSlider::SliderToMaximum;
        break;
    default:
        break;
    }

    if (action) {
        q_func()->setRepeatAction(action, threshold);
        q_func()->triggerAction(action);
    }
}